

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

XMLSize_t __thiscall xercesc_4_0::ElemStack::addLevel(ElemStack *this)

{
  XMLSize_t XVar1;
  StackElem **ppSVar2;
  StackElem *pSVar3;
  
  if (this->fStackTop == this->fStackCapacity) {
    expandStack(this);
  }
  if (this->fStack[this->fStackTop] == (StackElem *)0x0) {
    pSVar3 = (StackElem *)XMemory::operator_new(0x70,this->fMemoryManager);
    XVar1 = this->fStackTop;
    this->fStack[XVar1] = pSVar3;
    ppSVar2 = this->fStack;
    pSVar3 = ppSVar2[XVar1];
    pSVar3->fChildCapacity = 0;
    pSVar3->fChildren = (QName **)0x0;
    pSVar3 = ppSVar2[XVar1];
    pSVar3->fMap = (PrefMapElem *)0x0;
    pSVar3->fMapCapacity = 0;
    ppSVar2[XVar1]->fSchemaElemName = (XMLCh *)0x0;
    ppSVar2[XVar1]->fSchemaElemNameMaxLen = 0;
  }
  ppSVar2 = this->fStack;
  XVar1 = this->fStackTop;
  ppSVar2[XVar1]->fThisElement = (XMLElementDecl *)0x0;
  pSVar3 = ppSVar2[XVar1];
  pSVar3->fReaderNum = 0xffffffff;
  pSVar3->fChildCount = 0;
  pSVar3->fMapCount = 0;
  *(undefined4 *)((long)&pSVar3->fMapCount + 7) = 0;
  pSVar3->fCurrentURI = this->fUnknownNamespaceId;
  pSVar3->fCurrentScope = 0xfffffffe;
  pSVar3->fCurrentGrammar = (Grammar *)0x0;
  this->fStackTop = XVar1 + 1;
  return XVar1;
}

Assistant:

XMLSize_t ElemStack::addLevel()
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fChildCapacity = 0;
        fStack[fStackTop]->fChildren = 0;
        fStack[fStackTop]->fMapCapacity = 0;
        fStack[fStackTop]->fMap = 0;
        fStack[fStackTop]->fSchemaElemName = 0;
        fStack[fStackTop]->fSchemaElemNameMaxLen = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fThisElement = 0;
    fStack[fStackTop]->fReaderNum = 0xFFFFFFFF;
    fStack[fStackTop]->fChildCount = 0;
    fStack[fStackTop]->fMapCount = 0;
    fStack[fStackTop]->fValidationFlag = false;
    fStack[fStackTop]->fCommentOrPISeen = false;
    fStack[fStackTop]->fReferenceEscaped = false;
    fStack[fStackTop]->fCurrentURI = fUnknownNamespaceId;
    fStack[fStackTop]->fCurrentScope = Grammar::TOP_LEVEL_SCOPE;
    fStack[fStackTop]->fCurrentGrammar = 0;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}